

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,TempExpression *temp_expression)

{
  TempExpression *this_00;
  Temporary local_38;
  TempExpression *local_18;
  TempExpression *temp_expression_local;
  BlockFormerVisitor *this_local;
  
  local_18 = temp_expression;
  temp_expression_local = (TempExpression *)this;
  this_00 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary(&local_38,&local_18->temporary_);
  TempExpression::TempExpression(this_00,&local_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.expression_ = (Expression *)this_00;
  Temporary::~Temporary(&local_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(TempExpression* temp_expression) {
  tos_value_.expression_ = new TempExpression(temp_expression->temporary_);
}